

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O0

int __thiscall Close::clone(Close *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Close *this_00;
  Close *this_local;
  
  this_00 = (Close *)operator_new(0x30);
  Close(this_00,this);
  return (int)this_00;
}

Assistant:

BaseAction *Close::clone() {
    return (new Close(*this));
}